

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDARootfind(IDAMem IDA_mem)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  long in_RDI;
  double dVar6;
  double dVar7;
  int sgnchg;
  int zroot;
  int sideprev;
  int side;
  int imax;
  int retval;
  int i;
  sunrealtype fracsub;
  sunrealtype fracint;
  sunrealtype maxfrac;
  sunrealtype gfrac;
  sunrealtype tmid;
  sunrealtype alph;
  double local_78;
  double local_70;
  int local_54;
  int local_50;
  int local_4c;
  int local_44;
  N_Vector ypret;
  N_Vector in_stack_ffffffffffffffd8;
  undefined1 *ida_mem;
  int local_4;
  
  local_4c = 0;
  ypret = (N_Vector)0x0;
  bVar3 = false;
  bVar2 = false;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x7e8) + (long)local_44 * 4) != 0) {
      dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8));
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        pdVar1 = (double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8);
        if (((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
              (0.0 < *(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8))) ||
             ((0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) &&
              (pdVar1 = (double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8),
              *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
            ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
             *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0)) &&
           (in_stack_ffffffffffffffd8 =
                 (N_Vector)
                 ABS(*(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8) /
                     (*(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8) -
                     *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8))),
           (double)ypret < (double)in_stack_ffffffffffffffd8)) {
          bVar2 = true;
          local_4c = local_44;
          ypret = in_stack_ffffffffffffffd8;
        }
      }
      else if ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
               *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0) {
        bVar3 = true;
      }
    }
  }
  if (!bVar2) {
    *(undefined8 *)(in_RDI + 0x7a8) = *(undefined8 *)(in_RDI + 0x7a0);
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8);
    }
    if (bVar3) {
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 0x788) + (long)local_44 * 4) = 0;
        if ((((*(int *)(*(long *)(in_RDI + 0x7e8) + (long)local_44 * 4) != 0) &&
             (dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8)), dVar6 == 0.0
             )) && (!NAN(dVar6))) &&
           ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
            *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0)) {
          uVar5 = 1;
          if (0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8)) {
            uVar5 = 0xffffffff;
          }
          *(undefined4 *)(*(long *)(in_RDI + 0x788) + (long)local_44 * 4) = uVar5;
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    return local_4;
  }
  ida_mem = &DAT_3ff0000000000000;
  local_50 = 0;
  local_54 = -1;
  while( true ) {
    while( true ) {
      if (ABS(*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) <=
          *(double *)(in_RDI + 2000)) goto LAB_00120a44;
      if (local_54 == local_50) {
        if (local_50 == 2) {
          ida_mem = (undefined1 *)((double)ida_mem * 2.0);
        }
        else {
          ida_mem = (undefined1 *)((double)ida_mem * 0.5);
        }
      }
      else {
        ida_mem = &DAT_3ff0000000000000;
      }
      dVar6 = *(double *)(in_RDI + 0x7a0) -
              ((*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) *
              *(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_4c * 8)) /
              (-(double)ida_mem * *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_4c * 8) +
              *(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_4c * 8));
      if (ABS(dVar6 - *(double *)(in_RDI + 0x798)) < *(double *)(in_RDI + 2000) * 0.5) {
        local_70 = ABS(*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) /
                   *(double *)(in_RDI + 2000);
        if (local_70 <= 5.0) {
          local_70 = 0.5 / local_70;
        }
        else {
          local_70 = 0.1;
        }
        dVar6 = local_70 * (*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) +
                *(double *)(in_RDI + 0x798);
      }
      if (ABS(*(double *)(in_RDI + 0x7a0) - dVar6) < *(double *)(in_RDI + 2000) * 0.5) {
        local_78 = ABS(*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) /
                   *(double *)(in_RDI + 2000);
        if (local_78 <= 5.0) {
          local_78 = 0.5 / local_78;
        }
        else {
          local_78 = 0.1;
        }
        dVar6 = -local_78 * (*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) +
                *(double *)(in_RDI + 0x7a0);
      }
      IDAGetSolution(ida_mem,dVar6,in_stack_ffffffffffffffd8,ypret);
      iVar4 = (**(code **)(in_RDI + 0x778))
                        (dVar6,*(undefined8 *)(in_RDI + 0x280),*(undefined8 *)(in_RDI + 0x288),
                         *(undefined8 *)(in_RDI + 0x7c0),*(undefined8 *)(in_RDI + 0x18));
      *(long *)(in_RDI + 0x7e0) = *(long *)(in_RDI + 0x7e0) + 1;
      if (iVar4 != 0) {
        return -10;
      }
      ypret = (N_Vector)0x0;
      bVar3 = false;
      bVar2 = false;
      local_54 = local_50;
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
        if (*(int *)(*(long *)(in_RDI + 0x7e8) + (long)local_44 * 4) != 0) {
          dVar7 = ABS(*(double *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8));
          if ((dVar7 != 0.0) || (NAN(dVar7))) {
            pdVar1 = (double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8);
            if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
                 (0.0 < *(double *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8))) ||
                ((0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) &&
                 (pdVar1 = (double *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8),
                 *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
               (((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
                 *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0 &&
                (in_stack_ffffffffffffffd8 =
                      (N_Vector)
                      ABS(*(double *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8) /
                          (*(double *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8) -
                          *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8))),
                (double)ypret < (double)in_stack_ffffffffffffffd8)))) {
              bVar2 = true;
              local_4c = local_44;
              ypret = in_stack_ffffffffffffffd8;
            }
          }
          else if ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
                   *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0) {
            bVar3 = true;
          }
        }
      }
      if (!bVar2) break;
      *(double *)(in_RDI + 0x7a0) = dVar6;
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8);
      }
      local_50 = 1;
      if (ABS(*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) <=
          *(double *)(in_RDI + 2000)) goto LAB_00120a44;
    }
    if (bVar3) break;
    *(double *)(in_RDI + 0x798) = dVar6;
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8);
    }
    local_50 = 2;
    if (ABS(*(double *)(in_RDI + 0x7a0) - *(double *)(in_RDI + 0x798)) <= *(double *)(in_RDI + 2000)
       ) goto LAB_00120a44;
  }
  *(double *)(in_RDI + 0x7a0) = dVar6;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8);
  }
LAB_00120a44:
  *(undefined8 *)(in_RDI + 0x7a8) = *(undefined8 *)(in_RDI + 0x7a0);
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x780); local_44 = local_44 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x7c0) + (long)local_44 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8);
    *(undefined4 *)(*(long *)(in_RDI + 0x788) + (long)local_44 * 4) = 0;
    if (*(int *)(*(long *)(in_RDI + 0x7e8) + (long)local_44 * 4) != 0) {
      dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8));
      if (((dVar6 == 0.0) && (!NAN(dVar6))) &&
         ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
          *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0)) {
        uVar5 = 1;
        if (0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8)) {
          uVar5 = 0xffffffff;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x788) + (long)local_44 * 4) = uVar5;
      }
      pdVar1 = (double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8);
      if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
           (0.0 < *(double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8))) ||
          ((0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) &&
           (pdVar1 = (double *)(*(long *)(in_RDI + 0x7b8) + (long)local_44 * 8),
           *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
         ((double)*(int *)(*(long *)(in_RDI + 0x790) + (long)local_44 * 4) *
          *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8) <= 0.0)) {
        uVar5 = 1;
        if (0.0 < *(double *)(*(long *)(in_RDI + 0x7b0) + (long)local_44 * 8)) {
          uVar5 = 0xffffffff;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x788) + (long)local_44 * 4) = uVar5;
      }
    }
  }
  return 1;
}

Assistant:

static int IDARootfind(IDAMem IDA_mem)
{
  sunrealtype alph, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  sunbooleantype zroot, sgnchg;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot   = SUNFALSE;
  sgnchg  = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if (SUNRabs(IDA_mem->ida_ghi[i]) == ZERO)
    {
      if (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO)
      {
        zroot = SUNTRUE;
      }
    }
    else
    {
      if ((DIFFERENT_SIGN(IDA_mem->ida_glo[i], IDA_mem->ida_ghi[i])) &&
          (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO))
      {
        gfrac = SUNRabs(IDA_mem->ida_ghi[i] /
                        (IDA_mem->ida_ghi[i] - IDA_mem->ida_glo[i]));
        if (gfrac > maxfrac)
        {
          sgnchg  = SUNTRUE;
          maxfrac = gfrac;
          imax    = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     IDA_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg)
  {
    IDA_mem->ida_trout = IDA_mem->ida_thi;
    for (i = 0; i < IDA_mem->ida_nrtfn; i++)
    {
      IDA_mem->ida_grout[i] = IDA_mem->ida_ghi[i];
    }
    if (!zroot) { return (IDA_SUCCESS); }
    for (i = 0; i < IDA_mem->ida_nrtfn; i++)
    {
      IDA_mem->ida_iroots[i] = 0;
      if (!IDA_mem->ida_gactive[i]) { continue; }
      if ((SUNRabs(IDA_mem->ida_ghi[i]) == ZERO) &&
          (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO))
      {
        IDA_mem->ida_iroots[i] = IDA_mem->ida_glo[i] > 0 ? -1 : 1;
      }
    }
    return (RTFOUND);
  }

  /* Initialize alph to avoid compiler warning */
  alph = ONE;

  /* A sign change was found.  Loop to locate nearest root. */

  side     = 0;
  sideprev = -1;
  for (;;)
  { /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol)
    {
      break;
    }

    /* Set weight alph.
       On the first two passes, set alph = 1.  Thereafter, reset alph
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alph = 1.
       If the sides were the same, then double alph (if high side),
       or halve alph (if low side).
       The next guess tmid is the secant method value if alph = 1, but
       is closer to tlo if alph < 1, and closer to thi if alph > 1.    */

    if (sideprev == side) { alph = (side == 2) ? alph * TWO : alph * HALF; }
    else { alph = ONE; }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = IDA_mem->ida_thi -
           (IDA_mem->ida_thi - IDA_mem->ida_tlo) * IDA_mem->ida_ghi[imax] /
             (IDA_mem->ida_ghi[imax] - alph * IDA_mem->ida_glo[imax]);
    if (SUNRabs(tmid - IDA_mem->ida_tlo) < HALF * IDA_mem->ida_ttol)
    {
      fracint = SUNRabs(IDA_mem->ida_thi - IDA_mem->ida_tlo) / IDA_mem->ida_ttol;
      fracsub = (fracint > FIVE) ? PT1 : HALF / fracint;
      tmid = IDA_mem->ida_tlo + fracsub * (IDA_mem->ida_thi - IDA_mem->ida_tlo);
    }
    if (SUNRabs(IDA_mem->ida_thi - tmid) < HALF * IDA_mem->ida_ttol)
    {
      fracint = SUNRabs(IDA_mem->ida_thi - IDA_mem->ida_tlo) / IDA_mem->ida_ttol;
      fracsub = (fracint > FIVE) ? PT1 : HALF / fracint;
      tmid = IDA_mem->ida_thi - fracsub * (IDA_mem->ida_thi - IDA_mem->ida_tlo);
    }

    (void)IDAGetSolution(IDA_mem, tmid, IDA_mem->ida_yy, IDA_mem->ida_yp);
    retval = IDA_mem->ida_gfun(tmid, IDA_mem->ida_yy, IDA_mem->ida_yp,
                               IDA_mem->ida_grout, IDA_mem->ida_user_data);
    IDA_mem->ida_nge++;
    if (retval != 0) { return (IDA_RTFUNC_FAIL); }

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac  = ZERO;
    zroot    = SUNFALSE;
    sgnchg   = SUNFALSE;
    sideprev = side;
    for (i = 0; i < IDA_mem->ida_nrtfn; i++)
    {
      if (!IDA_mem->ida_gactive[i]) { continue; }
      if (SUNRabs(IDA_mem->ida_grout[i]) == ZERO)
      {
        if (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO)
        {
          zroot = SUNTRUE;
        }
      }
      else
      {
        if ((DIFFERENT_SIGN(IDA_mem->ida_glo[i], IDA_mem->ida_grout[i])) &&
            (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO))
        {
          gfrac = SUNRabs(IDA_mem->ida_grout[i] /
                          (IDA_mem->ida_grout[i] - IDA_mem->ida_glo[i]));
          if (gfrac > maxfrac)
          {
            sgnchg  = SUNTRUE;
            maxfrac = gfrac;
            imax    = i;
          }
        }
      }
    }
    if (sgnchg)
    {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      IDA_mem->ida_thi = tmid;
      for (i = 0; i < IDA_mem->ida_nrtfn; i++)
      {
        IDA_mem->ida_ghi[i] = IDA_mem->ida_grout[i];
      }
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol)
      {
        break;
      }
      continue; /* Return to looping point. */
    }

    if (zroot)
    {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      IDA_mem->ida_thi = tmid;
      for (i = 0; i < IDA_mem->ida_nrtfn; i++)
      {
        IDA_mem->ida_ghi[i] = IDA_mem->ida_grout[i];
      }
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    IDA_mem->ida_tlo = tmid;
    for (i = 0; i < IDA_mem->ida_nrtfn; i++)
    {
      IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
    }
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol)
    {
      break;
    }

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  IDA_mem->ida_trout = IDA_mem->ida_thi;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_grout[i]  = IDA_mem->ida_ghi[i];
    IDA_mem->ida_iroots[i] = 0;
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if ((SUNRabs(IDA_mem->ida_ghi[i]) == ZERO) &&
        (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO))
    {
      IDA_mem->ida_iroots[i] = IDA_mem->ida_glo[i] > 0 ? -1 : 1;
    }
    if ((DIFFERENT_SIGN(IDA_mem->ida_glo[i], IDA_mem->ida_ghi[i])) &&
        (IDA_mem->ida_rootdir[i] * IDA_mem->ida_glo[i] <= ZERO))
    {
      IDA_mem->ida_iroots[i] = IDA_mem->ida_glo[i] > 0 ? -1 : 1;
    }
  }
  return (RTFOUND);
}